

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlPatternAdd(xmlPatParserContextPtr ctxt,xmlPatternPtr comp,xmlPatOp op,xmlChar *value,
                 xmlChar *value2)

{
  xmlStepOpPtr pxVar1;
  int iVar2;
  
  if ((comp->maxStep <= comp->nbStep) && (iVar2 = xmlPatternGrow(comp), iVar2 < 0)) {
    ctxt->error = -1;
    return -1;
  }
  pxVar1 = comp->steps;
  iVar2 = comp->nbStep;
  pxVar1[iVar2].op = op;
  pxVar1[iVar2].value = value;
  pxVar1[iVar2].value2 = value2;
  comp->nbStep = iVar2 + 1;
  return 0;
}

Assistant:

static int
xmlPatternAdd(xmlPatParserContextPtr ctxt, xmlPatternPtr comp,
              xmlPatOp op, xmlChar * value, xmlChar * value2)
{
    if (comp->nbStep >= comp->maxStep) {
        if (xmlPatternGrow(comp) < 0) {
            ctxt->error = -1;
            return(-1);
        }
    }
    comp->steps[comp->nbStep].op = op;
    comp->steps[comp->nbStep].value = value;
    comp->steps[comp->nbStep].value2 = value2;
    comp->nbStep++;
    return(0);
}